

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ctl.c
# Opt level: O3

_Bool ctl_init(tsd_t *tsd)

{
  int iVar1;
  uint uVar2;
  base_t *pbVar3;
  ctl_arena_t *pcVar4;
  ctl_arenas_t *pcVar5;
  _Bool _Var6;
  size_t i;
  
  iVar1 = pthread_mutex_trylock((pthread_mutex_t *)((long)&ctl_mtx.field_0 + 0x48));
  if (iVar1 != 0) {
    duckdb_je_malloc_mutex_lock_slow(&ctl_mtx);
    ctl_mtx.field_0.field_0.locked.repr = (atomic_b_t)true;
  }
  ctl_mtx.field_0.field_0.prof_data.n_lock_ops = ctl_mtx.field_0.field_0.prof_data.n_lock_ops + 1;
  if (&(ctl_mtx.field_0.field_0.prof_data.prev_owner)->tsd != tsd) {
    ctl_mtx.field_0.witness.link.qre_prev =
         (witness_t *)(ctl_mtx.field_0.field_0.prof_data.n_owner_switches + 1);
    ctl_mtx.field_0.field_0.prof_data.prev_owner = (tsdn_t *)tsd;
  }
  if (ctl_initialized == '\0') {
    if (ctl_arenas == (ctl_arenas_t *)0x0) {
      pbVar3 = duckdb_je_b0get();
      ctl_arenas = (ctl_arenas_t *)duckdb_je_base_alloc((tsdn_t *)tsd,pbVar3,0x8020,0x10);
      if (ctl_arenas != (ctl_arenas_t *)0x0) goto LAB_0115fc6b;
LAB_0115fd7f:
      _Var6 = true;
      goto LAB_0115fc1d;
    }
LAB_0115fc6b:
    if (ctl_stats == (ctl_stats_t *)0x0) {
      pbVar3 = duckdb_je_b0get();
      ctl_stats = (ctl_stats_t *)duckdb_je_base_alloc((tsdn_t *)tsd,pbVar3,0x2e0,0x10);
      if (ctl_stats == (ctl_stats_t *)0x0) goto LAB_0115fd7f;
    }
    pcVar4 = arenas_i_impl(tsd,0x1000,false,true);
    _Var6 = true;
    if (pcVar4 == (ctl_arena_t *)0x0) goto LAB_0115fc1d;
    pcVar4->initialized = true;
    pcVar4 = arenas_i_impl(tsd,0x1001,false,true);
    if (pcVar4 == (ctl_arena_t *)0x0) goto LAB_0115fc1d;
    pcVar4->nthreads = 0;
    pcVar4->dss = "N/A";
    *(undefined4 *)&pcVar4->dirty_decay_ms = 0xffffffff;
    *(undefined4 *)((long)&pcVar4->dirty_decay_ms + 4) = 0xffffffff;
    *(undefined4 *)&pcVar4->muzzy_decay_ms = 0xffffffff;
    *(undefined4 *)((long)&pcVar4->muzzy_decay_ms + 4) = 0xffffffff;
    pcVar4->pactive = 0;
    pcVar4->pdirty = 0;
    pcVar4->pmuzzy = 0;
    switchD_005681f0::default(pcVar4->astats,0,0x9818);
    uVar2 = duckdb_je_narenas_total_get();
    pcVar5 = ctl_arenas;
    ctl_arenas->narenas = uVar2;
    if (uVar2 != 0) {
      i = 0;
      do {
        pcVar4 = arenas_i_impl(tsd,i,false,true);
        if (pcVar4 == (ctl_arena_t *)0x0) goto LAB_0115fc1d;
        i = i + 1;
        pcVar5 = ctl_arenas;
      } while (i < ctl_arenas->narenas);
    }
    (pcVar5->destroyed).qlh_first = (ctl_arena_t *)0x0;
    ctl_refresh((tsdn_t *)tsd);
    ctl_initialized = '\x01';
  }
  _Var6 = false;
LAB_0115fc1d:
  ctl_mtx.field_0.field_0.locked.repr = (atomic_b_t)false;
  pthread_mutex_unlock((pthread_mutex_t *)((long)&ctl_mtx.field_0 + 0x48));
  return _Var6;
}

Assistant:

static bool
ctl_init(tsd_t *tsd) {
	bool ret;
	tsdn_t *tsdn = tsd_tsdn(tsd);

	malloc_mutex_lock(tsdn, &ctl_mtx);
	if (!ctl_initialized) {
		ctl_arena_t *ctl_sarena, *ctl_darena;
		unsigned i;

		/*
		 * Allocate demand-zeroed space for pointers to the full
		 * range of supported arena indices.
		 */
		if (ctl_arenas == NULL) {
			ctl_arenas = (ctl_arenas_t *)base_alloc(tsdn,
			    b0get(), sizeof(ctl_arenas_t), QUANTUM);
			if (ctl_arenas == NULL) {
				ret = true;
				goto label_return;
			}
		}

		if (config_stats && ctl_stats == NULL) {
			ctl_stats = (ctl_stats_t *)base_alloc(tsdn, b0get(),
			    sizeof(ctl_stats_t), QUANTUM);
			if (ctl_stats == NULL) {
				ret = true;
				goto label_return;
			}
		}

		/*
		 * Allocate space for the current full range of arenas
		 * here rather than doing it lazily elsewhere, in order
		 * to limit when OOM-caused errors can occur.
		 */
		if ((ctl_sarena = arenas_i_impl(tsd, MALLCTL_ARENAS_ALL, false,
		    true)) == NULL) {
			ret = true;
			goto label_return;
		}
		ctl_sarena->initialized = true;

		if ((ctl_darena = arenas_i_impl(tsd, MALLCTL_ARENAS_DESTROYED,
		    false, true)) == NULL) {
			ret = true;
			goto label_return;
		}
		ctl_arena_clear(ctl_darena);
		/*
		 * Don't toggle ctl_darena to initialized until an arena is
		 * actually destroyed, so that arena.<i>.initialized can be used
		 * to query whether the stats are relevant.
		 */

		ctl_arenas->narenas = narenas_total_get();
		for (i = 0; i < ctl_arenas->narenas; i++) {
			if (arenas_i_impl(tsd, i, false, true) == NULL) {
				ret = true;
				goto label_return;
			}
		}

		ql_new(&ctl_arenas->destroyed);
		ctl_refresh(tsdn);

		ctl_initialized = true;
	}

	ret = false;
label_return:
	malloc_mutex_unlock(tsdn, &ctl_mtx);
	return ret;
}